

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * removeUnindexableInClauseTerms(Parse *pParse,int iEq,WhereLoop *pLoop,Expr *pX)

{
  long lVar1;
  ExprList *pEVar2;
  Expr *pEVar3;
  u32 uVar4;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  Expr *p;
  int iField;
  int i;
  ExprList *pLhs;
  ExprList *pRhs;
  ExprList *pOrigLhs;
  ExprList *pOrigRhs;
  Expr *pNew;
  Select *pSelect;
  sqlite3 *db;
  Expr *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int iVar5;
  Expr *in_stack_ffffffffffffffa8;
  Parse *pParse_00;
  sqlite3 *in_stack_ffffffffffffffb0;
  ExprList *pEList;
  ExprList *local_48;
  Select *local_30;
  
  lVar1 = *in_RDI;
  pEVar3 = sqlite3ExprDup(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                          in_stack_ffffffffffffffa4);
  if (*(char *)(lVar1 + 0x67) == '\0') {
    for (local_30 = (pEVar3->x).pSelect; local_30 != (Select *)0x0; local_30 = local_30->pPrior) {
      local_48 = (ExprList *)0x0;
      pEList = (ExprList *)0x0;
      pParse_00 = (Parse *)0x0;
      pEVar2 = local_30->pEList;
      iVar5 = in_ESI;
      if (local_30 == (Select *)(pEVar3->x).pList) {
        local_48 = (pEVar3->pLeft->x).pList;
      }
      for (; iVar5 < (int)(uint)*(ushort *)(in_RDX + 0x34); iVar5 = iVar5 + 1) {
        if ((**(long **)(*(long *)(in_RDX + 0x40) + (long)iVar5 * 8) == in_RCX) &&
           (in_stack_ffffffffffffffa0 =
                 *(int *)(*(long *)(*(long *)(in_RDX + 0x40) + (long)iVar5 * 8) + 0x24) + -1,
           pEVar2->a[in_stack_ffffffffffffffa0].pExpr != (Expr *)0x0)) {
          pEList = sqlite3ExprListAppend
                             (pParse_00,(ExprList *)CONCAT44(iVar5,in_stack_ffffffffffffffa0),
                              in_stack_ffffffffffffff98);
          pEVar2->a[in_stack_ffffffffffffffa0].pExpr = (Expr *)0x0;
          if (pEList != (ExprList *)0x0) {
            pEList->a[pEList->nExpr + -1].u.x.iOrderByCol = (short)in_stack_ffffffffffffffa0 + 1;
          }
          if (local_48 != (ExprList *)0x0) {
            pParse_00 = (Parse *)sqlite3ExprListAppend
                                           (pParse_00,
                                            (ExprList *)CONCAT44(iVar5,in_stack_ffffffffffffffa0),
                                            in_stack_ffffffffffffff98);
            local_48->a[in_stack_ffffffffffffffa0].pExpr = (Expr *)0x0;
          }
        }
      }
      sqlite3ExprListDelete
                ((sqlite3 *)CONCAT44(iVar5,in_stack_ffffffffffffffa0),
                 (ExprList *)in_stack_ffffffffffffff98);
      if (local_48 != (ExprList *)0x0) {
        sqlite3ExprListDelete
                  ((sqlite3 *)CONCAT44(iVar5,in_stack_ffffffffffffffa0),
                   (ExprList *)in_stack_ffffffffffffff98);
        (pEVar3->pLeft->x).pList = (ExprList *)pParse_00;
      }
      local_30->pEList = pEList;
      uVar4 = *(int *)((long)in_RDI + 0x94) + 1;
      *(u32 *)((long)in_RDI + 0x94) = uVar4;
      local_30->selId = uVar4;
      if ((pParse_00 != (Parse *)0x0) && (*(int *)&pParse_00->db == 1)) {
        in_stack_ffffffffffffff98 = ((ExprList_item *)&pParse_00->zErrMsg)->pExpr;
        ((ExprList_item *)&pParse_00->zErrMsg)->pExpr = (Expr *)0x0;
        sqlite3ExprDelete((sqlite3 *)CONCAT44(iVar5,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff98);
        pEVar3->pLeft = in_stack_ffffffffffffff98;
      }
      if (pEList != (ExprList *)0x0) {
        adjustOrderByCol(local_30->pOrderBy,pEList);
        adjustOrderByCol(local_30->pGroupBy,pEList);
        for (iVar5 = 0; iVar5 < pEList->nExpr; iVar5 = iVar5 + 1) {
          pEList->a[iVar5].u.x.iOrderByCol = 0;
        }
      }
    }
  }
  return pEVar3;
}

Assistant:

static Expr *removeUnindexableInClauseTerms(
  Parse *pParse,        /* The parsing context */
  int iEq,              /* Look at loop terms starting here */
  WhereLoop *pLoop,     /* The current loop */
  Expr *pX              /* The IN expression to be reduced */
){
  sqlite3 *db = pParse->db;
  Select *pSelect;            /* Pointer to the SELECT on the RHS */
  Expr *pNew;
  pNew = sqlite3ExprDup(db, pX, 0);
  if( db->mallocFailed==0 ){
    for(pSelect=pNew->x.pSelect; pSelect; pSelect=pSelect->pPrior){
      ExprList *pOrigRhs;         /* Original unmodified RHS */
      ExprList *pOrigLhs = 0;     /* Original unmodified LHS */
      ExprList *pRhs = 0;         /* New RHS after modifications */
      ExprList *pLhs = 0;         /* New LHS after mods */
      int i;                      /* Loop counter */

      assert( ExprUseXSelect(pNew) );
      pOrigRhs = pSelect->pEList;
      assert( pNew->pLeft!=0 );
      assert( ExprUseXList(pNew->pLeft) );
      if( pSelect==pNew->x.pSelect ){
        pOrigLhs = pNew->pLeft->x.pList;
      }
      for(i=iEq; i<pLoop->nLTerm; i++){
        if( pLoop->aLTerm[i]->pExpr==pX ){
          int iField;
          assert( (pLoop->aLTerm[i]->eOperator & (WO_OR|WO_AND))==0 );
          iField = pLoop->aLTerm[i]->u.x.iField - 1;
          if( pOrigRhs->a[iField].pExpr==0 ) continue; /* Duplicate PK column */
          pRhs = sqlite3ExprListAppend(pParse, pRhs, pOrigRhs->a[iField].pExpr);
          pOrigRhs->a[iField].pExpr = 0;
          if( pRhs ) pRhs->a[pRhs->nExpr-1].u.x.iOrderByCol = iField+1;
          if( pOrigLhs ){
            assert( pOrigLhs->a[iField].pExpr!=0 );
            pLhs = sqlite3ExprListAppend(pParse,pLhs,pOrigLhs->a[iField].pExpr);
            pOrigLhs->a[iField].pExpr = 0;
          }
        }
      }
      sqlite3ExprListDelete(db, pOrigRhs);
      if( pOrigLhs ){
        sqlite3ExprListDelete(db, pOrigLhs);
        pNew->pLeft->x.pList = pLhs;
      }
      pSelect->pEList = pRhs;
      pSelect->selId = ++pParse->nSelect; /* Req'd for SubrtnSig validity */
      if( pLhs && pLhs->nExpr==1 ){
        /* Take care here not to generate a TK_VECTOR containing only a
        ** single value. Since the parser never creates such a vector, some
        ** of the subroutines do not handle this case.  */
        Expr *p = pLhs->a[0].pExpr;
        pLhs->a[0].pExpr = 0;
        sqlite3ExprDelete(db, pNew->pLeft);
        pNew->pLeft = p;
      }

      /* If either the ORDER BY clause or the GROUP BY clause contains
      ** references to result-set columns, those references might now be
      ** obsolete.  So fix them up.
      */
      assert( pRhs!=0 || db->mallocFailed );
      if( pRhs ){
        adjustOrderByCol(pSelect->pOrderBy, pRhs);
        adjustOrderByCol(pSelect->pGroupBy, pRhs);
        for(i=0; i<pRhs->nExpr; i++) pRhs->a[i].u.x.iOrderByCol = 0;
      }

#if 0
      printf("For indexing, change the IN expr:\n");
      sqlite3TreeViewExpr(0, pX, 0);
      printf("Into:\n");
      sqlite3TreeViewExpr(0, pNew, 0);
#endif
    }
  }
  return pNew;
}